

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O2

hwaddr ppc_hash64_get_phys_page_debug(PowerPCCPU_conflict3 *cpu,target_ulong addr)

{
  ulong uVar1;
  int iVar2;
  ppc_slb_t *slb;
  hwaddr hVar3;
  uint64_t uVar4;
  ppc_hash_pte64_t *pte_00;
  uint apshift;
  ppc_hash_pte64_t pte;
  ppc_slb_t vrma_slbe;
  
  uVar1 = (cpu->env).msr;
  if ((uVar1 & 0x10) != 0) {
    slb = slb_lookup(cpu,addr);
    if (slb == (ppc_slb_t *)0x0) {
      return 0xffffffffffffffff;
    }
    goto LAB_009e129f;
  }
  if ((uVar1 & 0x1000000000000000) == 0) {
    if ((-1 < (long)addr) && ((cpu->env).has_hv_mode == false)) goto LAB_009e12f0;
  }
  else if (-1 < (long)addr) {
LAB_009e12f0:
    uVar1 = (cpu->env).spr[0x139];
    goto LAB_009e12f7;
  }
  if (((cpu->env).mmu_model == POWERPC_MMU_3_00) || (uVar1 = (cpu->env).spr[0x13e], (long)uVar1 < 0)
     ) {
    slb = &vrma_slbe;
    iVar2 = build_vrma_slbe(cpu,slb);
    if (iVar2 != 0) {
      return 0xffffffffffffffff;
    }
LAB_009e129f:
    pte_00 = &pte;
    hVar3 = ppc_hash64_htab_lookup(cpu,slb,addr,pte_00,&apshift);
    if (hVar3 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    uVar4 = deposit64(pte.pte1 & 0xffffffffffff000,apshift,(int)addr,(uint64_t)pte_00);
    return uVar4 & 0xfffffffffffff000;
  }
  if (*(ulong *)(rmls_limit_rma_sizes + ((uint)(uVar1 >> 0x17) & 0x78)) <=
      (addr & 0xfffffffffffffff)) {
    return 0xffffffffffffffff;
  }
  uVar1 = (cpu->env).spr[0x138];
LAB_009e12f7:
  return addr & 0xfffffffffffffff | uVar1;
}

Assistant:

hwaddr ppc_hash64_get_phys_page_debug(PowerPCCPU *cpu, target_ulong addr)
{
    CPUPPCState *env = &cpu->env;
    ppc_slb_t vrma_slbe;
    ppc_slb_t *slb;
    hwaddr ptex, raddr;
    ppc_hash_pte64_t pte;
    unsigned apshift;

    /* Handle real mode */
    if (msr_dr == 0) {
        /* In real mode the top 4 effective address bits are ignored */
        raddr = addr & 0x0FFFFFFFFFFFFFFFULL;

#if 0
        if (cpu->vhyp) {
            /*
             * In virtual hypervisor mode, there's nothing to do:
             *   EA == GPA == qemu guest address
             */
            return raddr;
        } else
#endif
        if ((msr_hv || !env->has_hv_mode) && !(addr >> 63)) {
            /* In HV mode, add HRMOR if top EA bit is clear */
            return raddr | env->spr[SPR_HRMOR];
        } else if (ppc_hash64_use_vrma(env)) {
            /* Emulated VRMA mode */
            slb = &vrma_slbe;
            if (build_vrma_slbe(cpu, slb) != 0) {
                return -1;
            }
        } else {
            target_ulong limit = rmls_limit(cpu);

            /* Emulated old-style RMO mode, bounds check against RMLS */
            if (raddr >= limit) {
                return -1;
            }
            return raddr | env->spr[SPR_RMOR];
        }
    } else {
        slb = slb_lookup(cpu, addr);
        if (!slb) {
            return -1;
        }
    }

    ptex = ppc_hash64_htab_lookup(cpu, slb, addr, &pte, &apshift);
    if (ptex == -1) {
        return -1;
    }

    return deposit64(pte.pte1 & HPTE64_R_RPN, 0, apshift, addr)
        & TARGET_PAGE_MASK;
}